

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O0

bool __thiscall
cmFindPackageCommand::CheckVersionFile
          (cmFindPackageCommand *this,string *version_file,string *result_version)

{
  cmMakefile *pcVar1;
  byte bVar2;
  bool bVar3;
  uint uVar4;
  char *pcVar5;
  undefined8 uVar6;
  ulong uVar7;
  byte local_45b;
  byte local_45a;
  allocator local_341;
  string local_340;
  uint local_31c;
  uint local_318;
  uint parsed_tweak;
  uint parsed_patch;
  uint parsed_minor;
  uint parsed_major;
  allocator local_2e1;
  string local_2e0;
  allocator local_2b9;
  string local_2b8;
  byte local_292;
  allocator local_291;
  undefined1 local_290 [6];
  bool unsuitable;
  byte local_26b;
  byte local_26a;
  allocator local_269;
  undefined1 local_268 [5];
  bool okay;
  bool suitable;
  allocator local_241;
  string local_240;
  allocator local_219;
  string local_218;
  allocator local_1f1;
  string local_1f0;
  allocator local_1c9;
  string local_1c8;
  char local_1a8 [8];
  char buf [64];
  string local_160;
  allocator local_139;
  string local_138;
  allocator local_111;
  string local_110;
  allocator local_e9;
  string local_e8;
  allocator local_c1;
  string local_c0;
  allocator local_99;
  string local_98;
  PolicyMap local_68;
  undefined1 local_38 [8];
  PolicyPushPop polScope;
  ScopePushPop varScope;
  string *result_version_local;
  string *version_file_local;
  cmFindPackageCommand *this_local;
  
  cmMakefile::ScopePushPop::ScopePushPop
            ((ScopePushPop *)&polScope.ReportError,
             (this->super_cmFindCommon).super_cmCommand.Makefile);
  pcVar1 = (this->super_cmFindCommon).super_cmCommand.Makefile;
  local_68.Status.super__Base_bitset<5UL>._M_w[2] = 0;
  local_68.Status.super__Base_bitset<5UL>._M_w[3] = 0;
  local_68.Status.super__Base_bitset<5UL>._M_w[0] = 0;
  local_68.Status.super__Base_bitset<5UL>._M_w[1] = 0;
  local_68.Status.super__Base_bitset<5UL>._M_w[4] = 0;
  cmPolicies::PolicyMap::PolicyMap(&local_68);
  cmMakefile::PolicyPushPop::PolicyPushPop((PolicyPushPop *)local_38,pcVar1,false,&local_68);
  pcVar1 = (this->super_cmFindCommon).super_cmCommand.Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_98,"PACKAGE_VERSION",&local_99);
  cmMakefile::RemoveDefinition(pcVar1,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator((allocator<char> *)&local_99);
  pcVar1 = (this->super_cmFindCommon).super_cmCommand.Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_c0,"PACKAGE_VERSION_UNSUITABLE",&local_c1);
  cmMakefile::RemoveDefinition(pcVar1,&local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_c1);
  pcVar1 = (this->super_cmFindCommon).super_cmCommand.Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_e8,"PACKAGE_VERSION_COMPATIBLE",&local_e9);
  cmMakefile::RemoveDefinition(pcVar1,&local_e8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_e9);
  pcVar1 = (this->super_cmFindCommon).super_cmCommand.Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_110,"PACKAGE_VERSION_EXACT",&local_111);
  cmMakefile::RemoveDefinition(pcVar1,&local_110);
  std::__cxx11::string::~string((string *)&local_110);
  std::allocator<char>::~allocator((allocator<char> *)&local_111);
  pcVar1 = (this->super_cmFindCommon).super_cmCommand.Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_138,"PACKAGE_FIND_NAME",&local_139);
  pcVar5 = (char *)std::__cxx11::string::c_str();
  cmMakefile::AddDefinition(pcVar1,&local_138,pcVar5);
  std::__cxx11::string::~string((string *)&local_138);
  std::allocator<char>::~allocator((allocator<char> *)&local_139);
  pcVar1 = (this->super_cmFindCommon).super_cmCommand.Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_160,"PACKAGE_FIND_VERSION",(allocator *)(buf + 0x3f));
  pcVar5 = (char *)std::__cxx11::string::c_str();
  cmMakefile::AddDefinition(pcVar1,&local_160,pcVar5);
  std::__cxx11::string::~string((string *)&local_160);
  std::allocator<char>::~allocator((allocator<char> *)(buf + 0x3f));
  sprintf(local_1a8,"%u",(ulong)this->VersionMajor);
  pcVar1 = (this->super_cmFindCommon).super_cmCommand.Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1c8,"PACKAGE_FIND_VERSION_MAJOR",&local_1c9);
  cmMakefile::AddDefinition(pcVar1,&local_1c8,local_1a8);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1c9);
  sprintf(local_1a8,"%u",(ulong)this->VersionMinor);
  pcVar1 = (this->super_cmFindCommon).super_cmCommand.Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1f0,"PACKAGE_FIND_VERSION_MINOR",&local_1f1);
  cmMakefile::AddDefinition(pcVar1,&local_1f0,local_1a8);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1f1);
  sprintf(local_1a8,"%u",(ulong)this->VersionPatch);
  pcVar1 = (this->super_cmFindCommon).super_cmCommand.Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_218,"PACKAGE_FIND_VERSION_PATCH",&local_219);
  cmMakefile::AddDefinition(pcVar1,&local_218,local_1a8);
  std::__cxx11::string::~string((string *)&local_218);
  std::allocator<char>::~allocator((allocator<char> *)&local_219);
  sprintf(local_1a8,"%u",(ulong)this->VersionTweak);
  pcVar1 = (this->super_cmFindCommon).super_cmCommand.Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_240,"PACKAGE_FIND_VERSION_TWEAK",&local_241);
  cmMakefile::AddDefinition(pcVar1,&local_240,local_1a8);
  std::__cxx11::string::~string((string *)&local_240);
  std::allocator<char>::~allocator((allocator<char> *)&local_241);
  sprintf(local_1a8,"%u",(ulong)this->VersionCount);
  pcVar1 = (this->super_cmFindCommon).super_cmCommand.Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_268,"PACKAGE_FIND_VERSION_COUNT",&local_269);
  cmMakefile::AddDefinition(pcVar1,(string *)local_268,local_1a8);
  std::__cxx11::string::~string((string *)local_268);
  std::allocator<char>::~allocator((allocator<char> *)&local_269);
  local_26a = 0;
  pcVar5 = (char *)std::__cxx11::string::c_str();
  bVar3 = ReadListFile(this,pcVar5,NoPolicyScope);
  if (bVar3) {
    pcVar1 = (this->super_cmFindCommon).super_cmCommand.Makefile;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)local_290,"PACKAGE_VERSION_EXACT",&local_291);
    bVar3 = cmMakefile::IsOn(pcVar1,(string *)local_290);
    std::__cxx11::string::~string((string *)local_290);
    std::allocator<char>::~allocator((allocator<char> *)&local_291);
    pcVar1 = (this->super_cmFindCommon).super_cmCommand.Makefile;
    local_26b = bVar3;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_2b8,"PACKAGE_VERSION_UNSUITABLE",&local_2b9);
    bVar3 = cmMakefile::IsOn(pcVar1,&local_2b8);
    std::__cxx11::string::~string((string *)&local_2b8);
    std::allocator<char>::~allocator((allocator<char> *)&local_2b9);
    local_292 = bVar3;
    if (((local_26b & 1) == 0) && ((this->VersionExact & 1U) == 0)) {
      pcVar1 = (this->super_cmFindCommon).super_cmCommand.Makefile;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_2e0,"PACKAGE_VERSION_COMPATIBLE",&local_2e1);
      local_26b = cmMakefile::IsOn(pcVar1,&local_2e0);
      std::__cxx11::string::~string((string *)&local_2e0);
      std::allocator<char>::~allocator((allocator<char> *)&local_2e1);
    }
    local_45a = 0;
    if ((local_292 & 1) == 0) {
      local_45b = 1;
      if ((local_26b & 1) == 0) {
        local_45b = std::__cxx11::string::empty();
      }
      local_45a = local_45b;
    }
    local_26a = local_45a & 1;
    if (local_26a != 0) {
      pcVar1 = (this->super_cmFindCommon).super_cmCommand.Makefile;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&parsed_major,"PACKAGE_VERSION",(allocator *)((long)&parsed_minor + 3));
      pcVar5 = cmMakefile::GetSafeDefinition(pcVar1,(string *)&parsed_major);
      std::__cxx11::string::operator=((string *)&this->VersionFound,pcVar5);
      std::__cxx11::string::~string((string *)&parsed_major);
      std::allocator<char>::~allocator((allocator<char> *)((long)&parsed_minor + 3));
      uVar6 = std::__cxx11::string::c_str();
      uVar4 = __isoc99_sscanf(uVar6,"%u.%u.%u.%u",&parsed_patch,&parsed_tweak,&local_318,&local_31c)
      ;
      this->VersionFoundCount = uVar4;
      switch(this->VersionFoundCount) {
      case 4:
        this->VersionFoundTweak = local_31c;
      case 3:
        this->VersionFoundPatch = local_318;
      case 2:
        this->VersionFoundMinor = parsed_tweak;
      case 1:
        this->VersionFoundMajor = parsed_patch;
      }
    }
  }
  pcVar1 = (this->super_cmFindCommon).super_cmCommand.Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_340,"PACKAGE_VERSION",&local_341);
  pcVar5 = cmMakefile::GetSafeDefinition(pcVar1,&local_340);
  std::__cxx11::string::operator=((string *)result_version,pcVar5);
  std::__cxx11::string::~string((string *)&local_340);
  std::allocator<char>::~allocator((allocator<char> *)&local_341);
  uVar7 = std::__cxx11::string::empty();
  if ((uVar7 & 1) != 0) {
    std::__cxx11::string::operator=((string *)result_version,"unknown");
  }
  bVar2 = local_26a;
  cmMakefile::PolicyPushPop::~PolicyPushPop((PolicyPushPop *)local_38);
  cmMakefile::ScopePushPop::~ScopePushPop((ScopePushPop *)&polScope.ReportError);
  return (bool)(bVar2 & 1);
}

Assistant:

bool cmFindPackageCommand::CheckVersionFile(std::string const& version_file,
                                            std::string& result_version)
{
  // The version file will be loaded in an isolated scope.
  cmMakefile::ScopePushPop varScope(this->Makefile);
  cmMakefile::PolicyPushPop polScope(this->Makefile);
  static_cast<void>(varScope);
  static_cast<void>(polScope);

  // Clear the output variables.
  this->Makefile->RemoveDefinition("PACKAGE_VERSION");
  this->Makefile->RemoveDefinition("PACKAGE_VERSION_UNSUITABLE");
  this->Makefile->RemoveDefinition("PACKAGE_VERSION_COMPATIBLE");
  this->Makefile->RemoveDefinition("PACKAGE_VERSION_EXACT");

  // Set the input variables.
  this->Makefile->AddDefinition("PACKAGE_FIND_NAME", this->Name.c_str());
  this->Makefile->AddDefinition("PACKAGE_FIND_VERSION",
                                this->Version.c_str());
  char buf[64];
  sprintf(buf, "%u", this->VersionMajor);
  this->Makefile->AddDefinition("PACKAGE_FIND_VERSION_MAJOR", buf);
  sprintf(buf, "%u", this->VersionMinor);
  this->Makefile->AddDefinition("PACKAGE_FIND_VERSION_MINOR", buf);
  sprintf(buf, "%u", this->VersionPatch);
  this->Makefile->AddDefinition("PACKAGE_FIND_VERSION_PATCH", buf);
  sprintf(buf, "%u", this->VersionTweak);
  this->Makefile->AddDefinition("PACKAGE_FIND_VERSION_TWEAK", buf);
  sprintf(buf, "%u", this->VersionCount);
  this->Makefile->AddDefinition("PACKAGE_FIND_VERSION_COUNT", buf);

  // Load the version check file.  Pass NoPolicyScope because we do
  // our own policy push/pop independent of CMP0011.
  bool suitable = false;
  if(this->ReadListFile(version_file.c_str(), NoPolicyScope))
    {
    // Check the output variables.
    bool okay = this->Makefile->IsOn("PACKAGE_VERSION_EXACT");
    bool unsuitable = this->Makefile->IsOn("PACKAGE_VERSION_UNSUITABLE");
    if(!okay && !this->VersionExact)
      {
      okay = this->Makefile->IsOn("PACKAGE_VERSION_COMPATIBLE");
      }

    // The package is suitable if the version is okay and not
    // explicitly unsuitable.
    suitable = !unsuitable && (okay || this->Version.empty());
    if(suitable)
      {
      // Get the version found.
      this->VersionFound =
        this->Makefile->GetSafeDefinition("PACKAGE_VERSION");

      // Try to parse the version number and store the results that were
      // successfully parsed.
      unsigned int parsed_major;
      unsigned int parsed_minor;
      unsigned int parsed_patch;
      unsigned int parsed_tweak;
      this->VersionFoundCount =
        sscanf(this->VersionFound.c_str(), "%u.%u.%u.%u",
               &parsed_major, &parsed_minor,
               &parsed_patch, &parsed_tweak);
      switch(this->VersionFoundCount)
        {
        case 4: this->VersionFoundTweak = parsed_tweak; // no break!
        case 3: this->VersionFoundPatch = parsed_patch; // no break!
        case 2: this->VersionFoundMinor = parsed_minor; // no break!
        case 1: this->VersionFoundMajor = parsed_major; // no break!
        default: break;
        }
      }
    }

  result_version = this->Makefile->GetSafeDefinition("PACKAGE_VERSION");
  if (result_version.empty())
    {
    result_version = "unknown";
    }

  // Succeed if the version is suitable.
  return suitable;
}